

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generator_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::anon_unknown_0::CodeGeneratorTest_BuildFeatureSetDefaults_Test::
~CodeGeneratorTest_BuildFeatureSetDefaults_Test
          (CodeGeneratorTest_BuildFeatureSetDefaults_Test *this)

{
  (this->super_CodeGeneratorTest).super_Test._vptr_Test =
       (_func_int **)&PTR__CodeGeneratorTest_018c7050;
  DescriptorPool::~DescriptorPool(&(this->super_CodeGeneratorTest).pool_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x88);
  return;
}

Assistant:

TEST_F(CodeGeneratorTest, BuildFeatureSetDefaults) {
  TestGenerator generator;
  generator.set_feature_extensions({});
  generator.set_minimum_edition(EDITION_99997_TEST_ONLY);
  generator.set_maximum_edition(EDITION_99999_TEST_ONLY);
  EXPECT_THAT(generator.BuildFeatureSetDefaults(),
              IsOkAndHolds(EqualsProto(R"pb(
                defaults {
                  edition: EDITION_LEGACY
                  overridable_features {}
                  fixed_features {
                    field_presence: EXPLICIT
                    enum_type: CLOSED
                    repeated_field_encoding: EXPANDED
                    utf8_validation: NONE
                    message_encoding: LENGTH_PREFIXED
                    json_format: LEGACY_BEST_EFFORT
                    enforce_naming_style: STYLE_LEGACY
                    default_symbol_visibility: EXPORT_ALL
                  }
                }
                defaults {
                  edition: EDITION_PROTO3
                  overridable_features {}
                  fixed_features {
                    field_presence: IMPLICIT
                    enum_type: OPEN
                    repeated_field_encoding: PACKED
                    utf8_validation: VERIFY
                    message_encoding: LENGTH_PREFIXED
                    json_format: ALLOW
                    enforce_naming_style: STYLE_LEGACY
                    default_symbol_visibility: EXPORT_ALL
                  }
                }
                defaults {
                  edition: EDITION_2023
                  overridable_features {
                    field_presence: EXPLICIT
                    enum_type: OPEN
                    repeated_field_encoding: PACKED
                    utf8_validation: VERIFY
                    message_encoding: LENGTH_PREFIXED
                    json_format: ALLOW
                  }
                  fixed_features {
                    enforce_naming_style: STYLE_LEGACY
                    default_symbol_visibility: EXPORT_ALL
                  }
                }
                defaults {
                  edition: EDITION_2024
                  overridable_features {
                    field_presence: EXPLICIT
                    enum_type: OPEN
                    repeated_field_encoding: PACKED
                    utf8_validation: VERIFY
                    message_encoding: LENGTH_PREFIXED
                    json_format: ALLOW
                    enforce_naming_style: STYLE2024
                    default_symbol_visibility: EXPORT_TOP_LEVEL
                  }
                  fixed_features {}
                }
                minimum_edition: EDITION_PROTO2
                maximum_edition: EDITION_2024
              )pb")));
}